

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O1

void __thiscall
CLI::Range::Range<double>(Range *this,double min_val,double max_val,string *validator_name)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream out;
  string local_1e8;
  string local_1c8;
  anon_class_16_2_ee34707b local_1a8;
  ostream local_198 [112];
  ios_base local_128 [264];
  
  pcVar1 = (validator_name->_M_dataplus)._M_p;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + validator_name->_M_string_length);
  Validator::Validator(&this->super_Validator,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if (validator_name->_M_string_length == 0) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>(local_198,"FLOAT",5);
    ::std::__ostream_insert<char,std::char_traits<char>>(local_198," in [",5);
    poVar2 = ::std::ostream::_M_insert<double>(min_val);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," - ",3);
    poVar2 = ::std::ostream::_M_insert<double>(max_val);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
    ::std::__cxx11::stringbuf::str();
    Validator::description(&this->super_Validator,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
    ::std::ios_base::~ios_base(local_128);
  }
  local_1a8.min_val = min_val;
  local_1a8.max_val = max_val;
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,&local_1a8);
  return;
}

Assistant:

Range(T min_val, T max_val, const std::string &validator_name = std::string{}) : Validator(validator_name) {
        if(validator_name.empty()) {
            std::stringstream out;
            out << detail::type_name<T>() << " in [" << min_val << " - " << max_val << "]";
            description(out.str());
        }

        func_ = [min_val, max_val](std::string &input) {
            using CLI::detail::lexical_cast;
            T val;
            bool converted = lexical_cast(input, val);
            if((!converted) || (val < min_val || val > max_val)) {
                std::stringstream out;
                out << "Value " << input << " not in range [";
                out << min_val << " - " << max_val << "]";
                return out.str();
            }
            return std::string{};
        };
    }